

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_9,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  int row_2;
  long lVar3;
  undefined4 *puVar4;
  Vector<float,_3> *pVVar5;
  long lVar6;
  int col;
  long lVar7;
  float v;
  float fVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Type in1;
  Vector<float,_3> res;
  Type in0;
  int aiStack_18 [6];
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&in0;
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      auVar9 = _DAT_019f34d0;
      do {
        bVar11 = SUB164(auVar9 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar7) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 + -0xc != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar7 + 0xc) = uVar12;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x30);
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 0xc;
      pfVar1 = pfVar1 + 1;
    } while (lVar6 != 3);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in0.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    in0.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    in0.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar2 = (Vector<float,_3> *)&in0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[2] = 0.0;
    puVar4 = &s_constInMat3x3;
    lVar3 = 0;
    do {
      lVar6 = 0;
      pVVar5 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar6];
        lVar6 = lVar6 + 1;
        pVVar5 = pVVar5 + 1;
      } while (lVar6 != 3);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
    in1.m_data[2] = (evalCtx->coords).m_data[2];
  }
  else {
    in1.m_data[0] = -0.2;
    in1.m_data[1] = 0.5;
    in1.m_data[2] = 0.8;
  }
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  pVVar2 = (Vector<float,_3> *)&in0;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar6 = 0;
    pVVar5 = pVVar2;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      in1.m_data[lVar6];
      lVar6 = lVar6 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar6 != 3);
    res.m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = in1.m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}